

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall DPolyobjInterpolation::Restore(DPolyobjInterpolation *this)

{
  double x;
  vertex_t *this_00;
  uint uVar1;
  vertex_t **ppvVar2;
  double *pdVar3;
  uint local_14;
  uint i;
  DPolyobjInterpolation *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<vertex_t_*,_vertex_t_*>::Size(&this->poly->Vertices);
    if (uVar1 <= local_14) break;
    ppvVar2 = TArray<vertex_t_*,_vertex_t_*>::operator[](&this->poly->Vertices,(ulong)local_14);
    this_00 = *ppvVar2;
    pdVar3 = TArray<double,_double>::operator[](&this->bakverts,(ulong)(local_14 << 1));
    x = *pdVar3;
    pdVar3 = TArray<double,_double>::operator[](&this->bakverts,(ulong)(local_14 * 2 + 1));
    vertex_t::set(this_00,x,*pdVar3);
    local_14 = local_14 + 1;
  }
  (this->poly->CenterSpot).pos.X = this->bakcx;
  (this->poly->CenterSpot).pos.Y = this->bakcy;
  FPolyObj::ClearSubsectorLinks(this->poly);
  return;
}

Assistant:

void DPolyobjInterpolation::Restore()
{
	for(unsigned int i = 0; i < poly->Vertices.Size(); i++)
	{
		poly->Vertices[i]->set(bakverts[i*2  ], bakverts[i*2+1]);
	}
	poly->CenterSpot.pos.X = bakcx;
	poly->CenterSpot.pos.Y = bakcy;
	poly->ClearSubsectorLinks();
}